

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalGenerator::CheckTargetsForType(cmGlobalGenerator *this)

{
  cmLocalGenerator *pcVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  cmake *this_01;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  TargetType TVar6;
  int iVar7;
  string *psVar8;
  long lVar9;
  pointer config;
  char *__end;
  pointer puVar10;
  string systemName;
  string local_b8;
  string local_98;
  pointer local_78;
  pointer local_70;
  cmGlobalGenerator *local_68;
  pointer local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  cmMakefile *local_38;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Swift","");
  bVar4 = cmState::GetLanguageEnabled
                    ((this->CMakeInstance->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    local_70 = (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_78 = (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_70 != local_78) {
      bVar4 = false;
      local_68 = this;
      do {
        pcVar1 = (local_70->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        puVar10 = *(pointer *)
                   &(pcVar1->GeneratorTargets).
                    super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                    ._M_impl;
        local_60 = *(pointer *)
                    ((long)&(pcVar1->GeneratorTargets).
                            super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                    + 8);
        if (puVar10 != local_60) {
          do {
            this_00 = *(cmMakefile **)
                       ((long)(puVar10->_M_t).
                              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       + 8);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"CMAKE_SYSTEM_NAME","");
            psVar8 = cmMakefile::GetSafeDefinition(this_00,&local_b8);
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            pcVar2 = (psVar8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,pcVar2,pcVar2 + psVar8->_M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            lVar9 = std::__cxx11::string::find((char *)&local_98,0x88a4fe,0);
            if ((lVar9 != -1) &&
               (TVar6 = cmGeneratorTarget::GetType
                                  ((cmGeneratorTarget *)
                                   (puVar10->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                  ), TVar6 == EXECUTABLE)) {
              cmMakefile::GetGeneratorConfigs_abi_cxx11_
                        (&local_58,
                         *(cmMakefile **)
                          ((long)(puVar10->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          + 8),IncludeEmptyConfig);
              pbVar3 = local_58.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (config = local_58.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start; config != pbVar3;
                  config = config + 1) {
                bVar5 = cmGeneratorTarget::IsWin32Executable
                                  ((cmGeneratorTarget *)
                                   (puVar10->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ,config);
                if (bVar5) {
                  cmGeneratorTarget::GetLinkerLanguage
                            (&local_b8,
                             (cmGeneratorTarget *)
                             (puVar10->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ,config);
                  iVar7 = std::__cxx11::string::compare((char *)&local_b8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p,
                                    local_b8.field_2._M_allocated_capacity + 1);
                  }
                  if (iVar7 == 0) {
                    this_01 = local_68->CMakeInstance;
                    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_b8,
                               "WIN32_EXECUTABLE property is not supported on Swift executables","")
                    ;
                    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&stack0xffffffffffffffc0);
                    cmake::IssueMessage(this_01,FATAL_ERROR,&local_b8,
                                        (cmListFileBacktrace *)&stack0xffffffffffffffc0);
                    if (local_38 != (cmMakefile *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                      operator_delete(local_b8._M_dataplus._M_p,
                                      local_b8.field_2._M_allocated_capacity + 1);
                    }
                    bVar4 = true;
                  }
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_58);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            puVar10 = puVar10 + 1;
          } while (puVar10 != local_60);
        }
        local_70 = local_70 + 1;
      } while (local_70 != local_78);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForType() const
{
  if (!this->GetLanguageEnabled("Swift")) {
    return false;
  }
  bool failed = false;
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& target : generator->GetGeneratorTargets()) {
      std::string systemName =
        target->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME");
      if (systemName.find("Windows") == std::string::npos) {
        continue;
      }

      if (target->GetType() == cmStateEnums::EXECUTABLE) {
        std::vector<std::string> const& configs =
          target->Makefile->GetGeneratorConfigs(
            cmMakefile::IncludeEmptyConfig);
        for (std::string const& config : configs) {
          if (target->IsWin32Executable(config) &&
              target->GetLinkerLanguage(config) == "Swift") {
            this->GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "WIN32_EXECUTABLE property is not supported on Swift "
              "executables",
              target->GetBacktrace());
            failed = true;
          }
        }
      }
    }
  }
  return failed;
}